

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start_Resume_R_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Start_Resume_R_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Start_Resume_R_PDU *this)

{
  ostream *poVar1;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KStringStream ss;
  KString local_280;
  KString local_260;
  KString local_240;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Start/Resume-R PDU-\n");
  Simulation_Management_Header::GetAsString_abi_cxx11_
            (&local_1e0,(Simulation_Management_Header *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"Real World Time:\n");
  DATA_TYPE::ClockTime::GetAsString_abi_cxx11_
            (&local_220,&(this->super_Start_Resume_PDU).m_RealWorldTime);
  UTILS::IndentString(&local_200,&local_220,Tabs,in_CL);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"Simulation Time:\n");
  DATA_TYPE::ClockTime::GetAsString_abi_cxx11_(&local_260,&(this->super_Start_Resume_PDU).m_SimTime)
  ;
  UTILS::IndentString(&local_240,&local_260,Tabs_00,in_CL);
  poVar1 = std::operator<<(poVar1,(string *)&local_240);
  Reliability_Header::GetAsString_abi_cxx11_(&local_280,&this->super_Reliability_Header);
  poVar1 = std::operator<<(poVar1,(string *)&local_280);
  poVar1 = std::operator<<(poVar1,"Request ID: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Start_Resume_R_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Start/Resume-R PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << "Real World Time:\n"
       << IndentString( m_RealWorldTime.GetAsString(), 1 )
       << "Simulation Time:\n"
       << IndentString( m_SimTime.GetAsString(), 1 )
       << Reliability_Header::GetAsString()
       << "Request ID: " << m_ui32RequestID
       << "\n";

    return ss.str();
}